

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall
cmTarget::GetLanguages
          (cmTarget *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *languages,string *config)

{
  cmGlobalGenerator *this_00;
  cmGeneratorTarget *this_01;
  pointer ppcVar1;
  pointer ppcVar2;
  pointer ppcVar3;
  vector<cmTarget_*,_std::allocator<cmTarget_*>_> objectLibraries;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> externalObjects;
  cmTarget *tgt;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sourceFiles;
  string objLib;
  _Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_> local_a8;
  _Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_88;
  cmTarget *local_70;
  _Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_68;
  string local_50;
  
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetSourceFiles(this,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&local_68,config);
  for (ppcVar1 = local_68._M_impl.super__Vector_impl_data._M_start;
      ppcVar1 != local_68._M_impl.super__Vector_impl_data._M_finish; ppcVar1 = ppcVar1 + 1) {
    cmSourceFile::GetLanguage_abi_cxx11_(&local_50,*ppcVar1);
    if (local_50._M_string_length != 0) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)languages,&local_50);
    }
    std::__cxx11::string::~string((string *)&local_50);
  }
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((this->Makefile->GeneratorTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    GetObjectLibrariesCMP0026(this,(vector<cmTarget_*,_std::allocator<cmTarget_*>_> *)&local_a8);
    ppcVar3 = local_a8._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    this_00 = cmMakefile::GetGlobalGenerator(this->Makefile);
    this_01 = cmGlobalGenerator::GetGeneratorTarget(this_00,this);
    cmGeneratorTarget::GetExternalObjects
              (this_01,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                       &local_88,config);
    for (ppcVar2 = local_88._M_impl.super__Vector_impl_data._M_start;
        ppcVar3 = local_a8._M_impl.super__Vector_impl_data._M_start,
        ppcVar2 != local_88._M_impl.super__Vector_impl_data._M_finish; ppcVar2 = ppcVar2 + 1) {
      cmSourceFile::GetObjectLibrary_abi_cxx11_(&local_50,*ppcVar2);
      local_70 = cmMakefile::FindTargetToUse(this->Makefile,&local_50,false);
      if (local_70 != (cmTarget *)0x0) {
        std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::push_back
                  ((vector<cmTarget_*,_std::allocator<cmTarget_*>_> *)&local_a8,&local_70);
      }
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  for (; ppcVar3 != local_a8._M_impl.super__Vector_impl_data._M_finish; ppcVar3 = ppcVar3 + 1) {
    GetLanguages(*ppcVar3,languages,config);
  }
  std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
            (&local_88);
  std::_Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>::~_Vector_base(&local_a8);
  std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base(&local_68);
  return;
}

Assistant:

void cmTarget::GetLanguages(std::set<std::string>& languages,
                            const std::string& config) const
{
  std::vector<cmSourceFile*> sourceFiles;
  this->GetSourceFiles(sourceFiles, config);
  for(std::vector<cmSourceFile*>::const_iterator
        i = sourceFiles.begin(); i != sourceFiles.end(); ++i)
    {
    const std::string& lang = (*i)->GetLanguage();
    if(!lang.empty())
      {
      languages.insert(lang);
      }
    }

  std::vector<cmTarget*> objectLibraries;
  std::vector<cmSourceFile const*> externalObjects;
  if (this->Makefile->GetGeneratorTargets().empty())
    {
    this->GetObjectLibrariesCMP0026(objectLibraries);
    }
  else
    {
    cmGeneratorTarget* gt = this->Makefile->GetGlobalGenerator()
                                ->GetGeneratorTarget(this);
    gt->GetExternalObjects(externalObjects, config);
    for(std::vector<cmSourceFile const*>::const_iterator
          i = externalObjects.begin(); i != externalObjects.end(); ++i)
      {
      std::string objLib = (*i)->GetObjectLibrary();
      if (cmTarget* tgt = this->Makefile->FindTargetToUse(objLib))
        {
        objectLibraries.push_back(tgt);
        }
      }
    }
  for(std::vector<cmTarget*>::const_iterator
      i = objectLibraries.begin(); i != objectLibraries.end(); ++i)
    {
    (*i)->GetLanguages(languages, config);
    }
}